

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  type_conflict1 tVar2;
  _Ios_Seekdir _Var3;
  undefined8 uVar4;
  size_type sVar5;
  long lVar6;
  _Alloc_hider *p_Var7;
  _Alloc_hider _Var8;
  char cVar9;
  bool bVar10;
  int iVar11;
  mapped_type mVar12;
  int iVar13;
  type_conflict1 tVar14;
  int iVar15;
  char *pcVar16;
  typed_value<int,_char> *ptVar17;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar18;
  const_iterator cVar19;
  long *plVar20;
  any *paVar21;
  uint *puVar22;
  ostream *poVar23;
  mapped_type *pmVar24;
  ulong uVar25;
  pointer pbVar26;
  _Ios_Seekdir *p_Var27;
  int *arg;
  long lVar28;
  long **pplVar29;
  key_type *pkVar30;
  _Ios_Iostate _Var31;
  int *__s;
  undefined1 *puVar32;
  undefined1 auVar33 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar34;
  undefined8 uStack_570;
  long *local_568;
  options_description desc;
  long local_558 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_540 [24];
  void *local_528;
  undefined4 local_520;
  undefined8 local_518;
  undefined4 local_510;
  long local_508;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_500 [24];
  undefined1 local_4e8 [8];
  positional_options_description p;
  long *local_4d0;
  long local_4c0 [2];
  undefined1 local_4b0 [8];
  ifstream source_file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  byte abStack_490 [16];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_480 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_460 [32];
  options_description *local_440;
  anon_union_16_2_ba345be5_for_m_Storage local_2a8;
  ulong local_298;
  anon_union_16_2_ba345be5_for_m_Storage local_290;
  ulong local_280;
  anon_union_16_2_ba345be5_for_m_Storage local_278;
  ulong local_268;
  undefined1 *local_260;
  ulong local_258;
  undefined1 local_250 [8];
  string intapetmp;
  string filename;
  string outtape;
  undefined1 local_1e8 [8];
  string fetch;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  know_label;
  variables_map vm;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_188 [8];
  _Rb_tree_node_base local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  undefined1 auStack_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  intape;
  ulong local_d8;
  int local_cc;
  pointer local_c8;
  pointer local_c0;
  char local_b8;
  int_type local_b4;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_b0;
  undefined1 local_a0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line_1;
  uint local_5c;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line;
  
  pplVar29 = &local_568;
  uStack_570 = 0x10e838;
  local_4b0 = (undefined1  [8])&local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"SimRam - RAM Emulator","");
  uStack_570 = 0x10e858;
  boost::program_options::options_description::options_description
            ((options_description *)&local_568,(string *)local_4b0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if (local_4b0 != (undefined1  [8])&local_4a0) {
    uStack_570 = 0x10e873;
    operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
  }
  uStack_570 = 0x10e87f;
  local_4b0 = (undefined1  [8])boost::program_options::options_description::add_options();
  uStack_570 = 0x10e89c;
  pcVar16 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_4b0,"help,h");
  uStack_570 = 0x10e8b2;
  pcVar16 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar16,"verbose,v");
  uStack_570 = 0x10e8bc;
  ptVar17 = boost::program_options::value<int>((int *)0x0);
  uStack_570 = 0x10e8d5;
  pcVar16 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar16,(value_semantic *)"registers,r",(char *)ptVar17);
  uStack_570 = 0x10e8df;
  ptVar18 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uStack_570 = 0x10e8f8;
  boost::program_options::options_description_easy_init::operator()
            (pcVar16,(value_semantic *)"input,i",(char *)ptVar18);
  uStack_570 = 0x10e904;
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)local_4e8);
  uStack_570 = 0x10e91c;
  boost::program_options::positional_options_description::add(local_4e8,0x1190da);
  uStack_570 = 0x10e928;
  boost::program_options::variables_map::variables_map
            ((variables_map *)&know_label._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uStack_570 = 0x10e93a;
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_4b0,argc,argv);
  uStack_570 = 0x10e950;
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_4b0)
  ;
  uStack_570 = 0x10e967;
  local_440 = (options_description *)&local_568;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_4b0);
  uStack_570 = 0x10e97a;
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)((long)&fetch.field_2 + 8),
             (basic_command_line_parser<char> *)local_4b0);
  uStack_570 = 0x10e98f;
  boost::program_options::store
            ((basic_parsed_options *)(fetch.field_2._M_local_buf + 8),
             (variables_map *)&know_label._M_t._M_impl.super__Rb_tree_header._M_node_count,false);
  uStack_570 = 0x10e99b;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)((long)&fetch.field_2 + 8));
  uStack_570 = 0x10e9a7;
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_460);
  uStack_570 = 0x10e9b3;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_480);
  uStack_570 = 0x10e9bf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4b0);
  uStack_570 = 0x10e9cb;
  boost::program_options::notify
            ((variables_map *)&know_label._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uStack_570 = 0x10e9e8;
  local_4b0 = (undefined1  [8])&local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"help","");
  uStack_570 = 0x10e9fe;
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_188,(key_type *)local_4b0);
  if (local_4b0 != (undefined1  [8])&local_4a0) {
    uStack_570 = 0x10ea23;
    operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
  }
  if (cVar19._M_node == &local_180) {
    uStack_570 = 0x10ea8d;
    local_4b0 = (undefined1  [8])&local_4a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"reg","");
    uStack_570 = 0x10ea9c;
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_188,(key_type *)local_4b0);
    if (local_4b0 != (undefined1  [8])&local_4a0) {
      uStack_570 = 0x10eaba;
      operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
    }
    if (cVar19._M_node == &local_180) {
      local_5c = 5;
    }
    else {
      uStack_570 = 0x10eae0;
      local_4b0 = (undefined1  [8])&local_4a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"reg","");
      uStack_570 = 0x10eaf3;
      paVar21 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)
                                  &know_label._M_t._M_impl.super__Rb_tree_header._M_node_count);
      uStack_570 = 0x10eafb;
      puVar22 = (uint *)boost::any_cast<int_const&>(paVar21);
      local_5c = *puVar22;
      if (local_4b0 != (undefined1  [8])&local_4a0) {
        uStack_570 = 0x10eb1b;
        operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
      }
      uStack_570 = 0x10eb38;
      local_4b0 = (undefined1  [8])&local_4a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"verbose","");
      uStack_570 = 0x10eb47;
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_188,(key_type *)local_4b0);
      if (local_4b0 != (undefined1  [8])&local_4a0) {
        uStack_570 = 0x10eb65;
        operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
      }
      if (cVar19._M_node != &local_180) {
        uStack_570 = 0x10eb82;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The number of virtual registers was set to ",0x2b);
        uStack_570 = 0x10eb91;
        plVar20 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_5c);
        uStack_570 = 0x10eba8;
        std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
        uStack_570 = 0x10ebb3;
        std::ostream::put((char)plVar20);
        uStack_570 = 0x10ebbb;
        std::ostream::flush();
      }
    }
    intapetmp.field_2._8_8_ = &filename._M_string_length;
    uStack_570 = 0x10ebe9;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&intapetmp.field_2 + 8),"input.ram","");
    uStack_570 = 0x10ec06;
    local_4b0 = (undefined1  [8])&local_4a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"input","");
    uStack_570 = 0x10ec15;
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_188,(key_type *)local_4b0);
    if (local_4b0 != (undefined1  [8])&local_4a0) {
      uStack_570 = 0x10ec33;
      operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
    }
    if (cVar19._M_node != &local_180) {
      uStack_570 = 0x10ec59;
      local_4b0 = (undefined1  [8])&local_4a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"input","");
      uStack_570 = 0x10ec6c;
      paVar21 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)
                                  &know_label._M_t._M_impl.super__Rb_tree_header._M_node_count);
      uStack_570 = 0x10ec74;
      boost::any_cast<std::__cxx11::string_const&>(paVar21);
      uStack_570 = 0x10ec83;
      std::__cxx11::string::_M_assign((string *)(intapetmp.field_2._M_local_buf + 8));
      if (local_4b0 != (undefined1  [8])&local_4a0) {
        uStack_570 = 0x10ec9e;
        operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
      }
      uStack_570 = 0x10ecbb;
      local_4b0 = (undefined1  [8])&local_4a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"verbose","");
      uStack_570 = 0x10ecca;
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_188,(key_type *)local_4b0);
      if (local_4b0 != (undefined1  [8])&local_4a0) {
        uStack_570 = 0x10ece8;
        operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
      }
      if (cVar19._M_node != &local_180) {
        uStack_570 = 0x10ed05;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The source code was set to \'",0x1c);
        uStack_570 = 0x10ed1f;
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)intapetmp.field_2._8_8_,
                             (long)filename._M_dataplus._M_p);
        uStack_570 = 0x10ed36;
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\'",1);
        uStack_570 = 0x10ed4a;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
        uStack_570 = 0x10ed55;
        std::ostream::put((char)poVar23);
        uStack_570 = 0x10ed5d;
        std::ostream::flush();
      }
    }
    uStack_570 = 0x10ed75;
    std::ifstream::ifstream(local_4b0,(char *)intapetmp.field_2._8_8_,_S_in);
    uStack_570 = 0x10ed81;
    cVar9 = std::__basic_file<char>::is_open();
    if (cVar9 == '\0') {
      uStack_570 = 0x11155c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<!> Unable to open file",0x17);
      uStack_570 = 0x111570;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      uStack_570 = 0x11157f;
      std::ostream::put(-8);
      iVar11 = 1;
      uStack_570 = 0x11158d;
      std::ostream::flush();
      pplVar29 = &local_568;
    }
    else {
      lVar6 = -((ulong)local_5c * 4 + 0xf & 0xfffffffffffffff0);
      __s = (int *)((long)&local_568 + lVar6);
      local_260 = (undefined1 *)&local_568;
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10edbf;
      memset(__s,0,(long)(int)local_5c << 2);
      local_250 = (undefined1  [8])&intapetmp._M_string_length;
      intapetmp._M_dataplus._M_p = (pointer)0x0;
      intapetmp._M_string_length._0_1_ = 0;
      filename.field_2._8_8_ = &outtape._M_string_length;
      outtape._M_dataplus._M_p = (pointer)0x0;
      outtape._M_string_length._0_1_ = 0;
      intape.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_f8 = (undefined1  [8])0x0;
      intape.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ee0a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Insert input tape (use comma for insert new value): ",0x34);
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ee1d;
      std::operator>>((istream *)&std::cin,(string *)local_250);
      fetch.field_2._8_8_ = anon_var_dwarf_d67a;
      know_label._M_t._M_impl._0_8_ = (long)"," + 1;
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ee45;
      boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                ((is_any_ofF<char> *)&local_290,
                 (iterator_range<const_char_*> *)((long)&fetch.field_2 + 8));
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ee64;
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                 (is_any_ofF<char> *)&local_290,token_compress_off);
      if ((0x10 < local_280) && (local_290.m_dynSet != (set_value_type *)0x0)) {
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ee7f;
        operator_delete__(local_290.m_dynSet);
      }
      p_Var1 = &know_label._M_t._M_impl.super__Rb_tree_header;
      fetch.field_2._8_8_ = p_Var1;
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10eea4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&fetch.field_2 + 8),"verbose","");
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10eeb3;
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_188,(key_type *)((long)&fetch.field_2 + 8));
      uVar4 = fetch.field_2._8_8_;
      if ((_Rb_tree_header *)fetch.field_2._8_8_ != p_Var1) {
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10eed1;
        operator_delete((void *)uVar4,
                        know_label._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      if (cVar19._M_node != &local_180) {
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10eef5;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"There are ",10);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ef13;
        poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ef2a;
        std::__ostream_insert<char,std::char_traits<char>>(poVar23," values in the tape.",0x14);
        uVar4 = *(undefined8 *)(*(long *)poVar23 + -0x18);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ef3e;
        std::ios::widen((char)uVar4 + (char)poVar23);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ef49;
        std::ostream::put((char)poVar23);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ef51;
        std::ostream::flush();
      }
      local_258 = (ulong)local_5c;
      local_1e8 = (undefined1  [8])&fetch._M_string_length;
      fetch._M_dataplus._M_p = (pointer)0x0;
      fetch._M_string_length._0_1_ = 0;
      know_label._M_t._M_impl._0_8_ = know_label._M_t._M_impl._0_8_ & 0xffffffff00000000;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&know_label;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&know_label;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      puVar32 = local_4b0 + *(long *)((long)local_4b0 + -0x18);
      _Var31 = (_Ios_Iostate)puVar32;
      if ((abStack_490[*(long *)((long)local_4b0 + -0x18)] & 2) == 0) {
        do {
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10efcc;
          cVar9 = std::ios::widen((char)puVar32);
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10efda;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_4b0,(string *)local_1e8,cVar9);
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10efe5;
          iVar11 = std::__cxx11::string::compare((char *)local_1e8);
          if ((iVar11 != 0) && (*(char *)local_1e8 != '#')) {
            auStack_58 = (undefined1  [8])0x0;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_b0.start = " ";
            local_b0.finish = "";
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f03e;
            boost::algorithm::detail::is_any_ofF<char>::
            is_any_ofF<boost::iterator_range<char_const*>>
                      ((is_any_ofF<char> *)&local_2a8,(iterator_range<const_char_*> *)&local_b0);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f051;
            boost::algorithm::
            split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e8,(is_any_ofF<char> *)&local_2a8,token_compress_off);
            uVar4 = local_2a8.m_dynSet;
            if ((0x10 < local_298) && (local_2a8.m_dynSet != (set_value_type *)0x0)) {
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f06c;
              operator_delete__((void *)uVar4);
            }
            auVar33 = auStack_58;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f07c;
            iVar11 = std::__cxx11::string::compare((char *)auVar33);
            if (iVar11 == 0) {
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f088;
              mVar12 = std::istream::tellg();
              pkVar30 = (key_type *)((long)auStack_58 + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f09f;
              pmVar24 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)((long)&fetch.field_2 + 8),pkVar30);
              *pmVar24 = mVar12;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f0aa;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_58);
          }
          puVar32 = local_4b0 + *(long *)((long)local_4b0 + -0x18);
          _Var31 = (_Ios_Iostate)puVar32;
        } while ((abStack_490[*(long *)((long)local_4b0 + -0x18)] & 2) == 0);
      }
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f0d1;
      std::ios::clear(_Var31);
      iVar11 = 0;
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f0e4;
      std::istream::seekg((long)local_4b0,_S_beg);
      local_a0._20_4_ = 0;
      do {
        if ((abStack_490[*(long *)((long)local_4b0 + -0x18)] & 2) != 0) goto LAB_001115ee;
        puVar32 = local_4b0 + *(long *)((long)local_4b0 + -0x18);
        while( true ) {
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f138;
          cVar9 = std::ios::widen((char)puVar32);
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f146;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_4b0,(string *)local_1e8,cVar9);
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f151;
          iVar13 = std::__cxx11::string::compare((char *)local_1e8);
          if (iVar13 == 0) {
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1115aa;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Completed execution with output: ",0x21);
            _Var8 = outtape._M_dataplus;
            uVar4 = filename.field_2._8_8_;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1115c4;
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)uVar4,(long)_Var8._M_p);
            uVar4 = *(undefined8 *)(*(long *)poVar23 + -0x18);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1115db;
            std::ios::widen((char)uVar4 + (char)poVar23);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1115e6;
            std::ostream::put((char)poVar23);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1115ee;
            std::ostream::flush();
            goto LAB_001115ee;
          }
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f164;
          iVar13 = std::__cxx11::string::compare((char *)local_1e8);
          if ((iVar13 != 0) && (*(char *)local_1e8 != '#')) break;
          puVar32 = local_4b0 + *(long *)((long)local_4b0 + -0x18);
          if ((abStack_490[*(long *)((long)local_4b0 + -0x18)] & 2) != 0) goto LAB_001115ee;
        }
        local_a0._24_8_ = (char *)0x0;
        line_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        line_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_58 = (undefined1  [8])0x119334;
        line.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x119335;
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f1ca;
        boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                  ((is_any_ofF<char> *)&local_278,(iterator_range<const_char_*> *)auStack_58);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f1e2;
        boost::algorithm::
        split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_a0 + 0x18),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   (is_any_ofF<char> *)&local_278,token_compress_off);
        uVar4 = local_278.m_dynSet;
        if ((0x10 < local_268) && (local_278.m_dynSet != (set_value_type *)0x0)) {
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f201;
          operator_delete__((void *)uVar4);
        }
        uVar4 = local_a0._24_8_;
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f211;
        iVar13 = std::__cxx11::string::compare((char *)uVar4);
        uVar4 = local_a0._24_8_;
        if (iVar13 == 0) {
          auStack_58 = (undefined1  [8])
                       &line.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f50d;
          std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f51c;
          cVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   ::find(local_188,(key_type *)auStack_58);
          auVar33 = auStack_58;
          if (auStack_58 !=
              (undefined1  [8])
              &line.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
            p_Var7 = &(line.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f538;
            operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
          }
          if (cVar19._M_node != &local_180) {
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f560;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read: ",6);
            pcVar16 = (((pointer)((long)auStack_f8 + (long)(int)local_a0._20_4_ * 0x20))->
                      _M_dataplus)._M_p;
            sVar5 = ((pointer)((long)auStack_f8 + (long)(int)local_a0._20_4_ * 0x20))->
                    _M_string_length;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f587;
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pcVar16,sVar5);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f59e;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," --> M[",7);
            pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
            lVar28 = *(long *)(local_a0._24_8_ + 0x28);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f5b2;
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>(poVar23,pcVar16,lVar28);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f5c9;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]",1);
            uVar4 = *(undefined8 *)(*(long *)poVar23 + -0x18);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f5dd;
            std::ios::widen((char)uVar4 + (char)poVar23);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f5e8;
            std::ostream::put((char)poVar23);
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f5f0;
            std::ostream::flush();
          }
          local_c8 = (pointer)((ulong)local_c8 & 0xffffffff00000000);
          local_b0.start = *(char **)(local_a0._24_8_ + 0x20);
          local_b0.finish =
               (char *)((long)&(((pointer)local_b0.start)->_M_dataplus)._M_p +
                       *(long *)(local_a0._24_8_ + 0x28));
          line.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0.start;
          line.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0.finish;
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f642;
          bVar10 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                   shr_signed<int>(&local_b0,(int *)&local_c8);
          if (!bVar10) {
            auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1117cf;
            boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
          }
          tVar14 = (type_conflict1)local_c8;
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f658;
          bVar10 = error_registers(tVar14,local_5c);
          if (!bVar10) {
            uVar25 = (ulong)(int)local_a0._20_4_;
            if ((ulong)((long)intape.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_f8 >> 5) <=
                uVar25) {
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fb6d;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"<!> The input tape is finished.",0x1f);
              uVar4 = *(undefined8 *)(std::cerr + -0x18);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fb88;
              std::ios::widen((char)uVar4 + 'x');
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fb97;
              std::ostream::put('x');
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fb9f;
              std::ostream::flush();
              iVar11 = 1;
              iVar13 = 1;
              goto LAB_0011009d;
            }
            local_c8 = (pointer)((ulong)local_c8 & 0xffffffff00000000);
            local_b0.start = (((pointer)((long)auStack_f8 + uVar25 * 0x20))->_M_dataplus)._M_p;
            local_b0.finish =
                 (char *)((long)&(((pointer)local_b0.start)->_M_dataplus)._M_p +
                         ((pointer)((long)auStack_f8 + uVar25 * 0x20))->_M_string_length);
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0.start;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0.finish;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f6dd;
            bVar10 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                     shr_signed<int>(&local_b0,(int *)&local_c8);
            if (!bVar10) {
              auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111873;
              boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
            }
            tVar14 = (type_conflict1)local_c8;
            local_c8 = (pointer)((ulong)local_c8 & 0xffffffff00000000);
            local_b0.start = *(char **)(local_a0._24_8_ + 0x20);
            local_b0.finish =
                 (char *)((long)&(((pointer)local_b0.start)->_M_dataplus)._M_p +
                         *(long *)(local_a0._24_8_ + 0x28));
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0.start;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0.finish;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f73d;
            bVar10 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                     shr_signed<int>(&local_b0,(int *)&local_c8);
            if (!bVar10) {
              auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11189c;
              boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
            }
            tVar2 = (type_conflict1)local_c8;
LAB_0010f98d:
            __s[(int)tVar2] = tVar14;
            local_a0._20_4_ = local_a0._20_4_ + 1;
            goto LAB_0011009b;
          }
LAB_0010fb4a:
          iVar11 = 1;
          iVar13 = 1;
        }
        else {
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f229;
          iVar13 = std::__cxx11::string::compare((char *)uVar4);
          uVar4 = local_a0._24_8_;
          if (iVar13 == 0) {
            auStack_58 = (undefined1  [8])
                         &line.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f773;
            std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f782;
            cVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     ::find(local_188,(key_type *)auStack_58);
            auVar33 = auStack_58;
            if (auStack_58 !=
                (undefined1  [8])
                &line.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
              p_Var7 = &(line.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f79e;
              operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
            }
            if (cVar19._M_node != &local_180) {
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f7c6;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read: ",6);
              pcVar16 = (((pointer)((long)auStack_f8 + (long)(int)local_a0._20_4_ * 0x20))->
                        _M_dataplus)._M_p;
              sVar5 = ((pointer)((long)auStack_f8 + (long)(int)local_a0._20_4_ * 0x20))->
                      _M_string_length;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f7ed;
              poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,pcVar16,sVar5);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f804;
              std::__ostream_insert<char,std::char_traits<char>>(poVar23," --> M[M[",9);
              pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
              lVar28 = *(long *)(local_a0._24_8_ + 0x28);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f818;
              poVar23 = std::__ostream_insert<char,std::char_traits<char>>(poVar23,pcVar16,lVar28);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f82f;
              std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]]",2);
              uVar4 = *(undefined8 *)(*(long *)poVar23 + -0x18);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f843;
              std::ios::widen((char)uVar4 + (char)poVar23);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f84e;
              std::ostream::put((char)poVar23);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f856;
              std::ostream::flush();
            }
            local_c8 = (pointer)((ulong)local_c8 & 0xffffffff00000000);
            local_b0.start = *(char **)(local_a0._24_8_ + 0x20);
            local_b0.finish =
                 (char *)((long)&(((pointer)local_b0.start)->_M_dataplus)._M_p +
                         *(long *)(local_a0._24_8_ + 0x28));
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0.start;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0.finish;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f8a8;
            bVar10 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                     shr_signed<int>(&local_b0,(int *)&local_c8);
            if (!bVar10) {
              auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1117f8;
              boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
            }
            tVar14 = (type_conflict1)local_c8;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f8be;
            bVar10 = error_registers(tVar14,local_5c);
            if (!bVar10) {
              local_c8 = (pointer)((ulong)local_c8 & 0xffffffff00000000);
              local_b0.start = *(char **)(local_a0._24_8_ + 0x20);
              local_b0.finish =
                   (char *)((long)&(((pointer)local_b0.start)->_M_dataplus)._M_p +
                           *(long *)(local_a0._24_8_ + 0x28));
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0.start;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0.finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f91d;
              bVar10 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                       shr_signed<int>(&local_b0,(int *)&local_c8);
              if (!bVar10) {
                auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo
                ;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11184a;
                boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
              }
              iVar13 = __s[(int)(type_conflict1)local_c8];
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f93b;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                if ((ulong)((long)intape.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_f8 >> 5)
                    <= (ulong)(long)(int)local_a0._20_4_) {
                  poVar23 = (ostream *)&std::cerr;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ffcc;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"<!> The input tape is finished.",0x1f);
                  goto LAB_0010ffcc;
                }
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_f8 + (long)(int)local_a0._20_4_ * 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f974;
                tVar14 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f983;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                tVar2 = __s[iVar13];
                goto LAB_0010f98d;
              }
            }
            goto LAB_0010fb4a;
          }
          *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f241;
          iVar13 = std::__cxx11::string::compare((char *)uVar4);
          uVar4 = local_a0._24_8_;
          if (iVar13 == 0) {
            auStack_58 = (undefined1  [8])
                         &line.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f9b9;
            std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f9c8;
            cVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     ::find(local_188,(key_type *)auStack_58);
            auVar33 = auStack_58;
            if (auStack_58 !=
                (undefined1  [8])
                &line.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
              p_Var7 = &(line.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f9e4;
              operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
            }
            if (cVar19._M_node != &local_180) {
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fa0c;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Write: M[",9);
              pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
              lVar28 = *(long *)(local_a0._24_8_ + 0x28);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fa24;
              poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,pcVar16,lVar28);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fa3b;
              std::__ostream_insert<char,std::char_traits<char>>(poVar23,"] = ",4);
              local_c8 = (pointer)((ulong)local_c8 & 0xffffffff00000000);
              local_b0.start = *(char **)(local_a0._24_8_ + 0x20);
              local_b0.finish =
                   (char *)((long)&(((pointer)local_b0.start)->_M_dataplus)._M_p +
                           *(long *)(local_a0._24_8_ + 0x28));
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0.start;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0.finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fa8d;
              bVar10 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                       shr_signed<int>(&local_b0,(int *)&local_c8);
              if (!bVar10) {
                auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo
                ;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1118c5;
                boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
              }
              iVar13 = __s[(int)(type_conflict1)local_c8];
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10faab;
              plVar20 = (long *)std::ostream::operator<<((ostream *)poVar23,iVar13);
              uVar4 = *(undefined8 *)(*plVar20 + -0x18);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fac2;
              std::ios::widen((char)uVar4 + (char)plVar20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10facd;
              std::ostream::put((char)plVar20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fad5;
              std::ostream::flush();
            }
            local_c8 = (pointer)((ulong)local_c8 & 0xffffffff00000000);
            local_b0.start = *(char **)(local_a0._24_8_ + 0x20);
            local_b0.finish =
                 (char *)((long)&(((pointer)local_b0.start)->_M_dataplus)._M_p +
                         *(long *)(local_a0._24_8_ + 0x28));
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0.start;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0.finish;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fb27;
            bVar10 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                     shr_signed<int>(&local_b0,(int *)&local_c8);
            if (!bVar10) {
              auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111821;
              boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
            }
            tVar14 = (type_conflict1)local_c8;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fb3d;
            bVar10 = error_registers(tVar14,local_5c);
            if (bVar10) goto LAB_0010fb4a;
            local_cc = 0;
            local_c8 = *(pointer *)(local_a0._24_8_ + 0x20);
            local_c0 = (pointer)((long)&(local_c8->_M_dataplus)._M_p +
                                *(long *)(local_a0._24_8_ + 0x28));
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = local_c8;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = local_c0;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fcc8;
            bVar10 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                     shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)
                                     &local_c8,&local_cc);
            if (!bVar10) {
              auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
              *(undefined1 **)((long)&uStack_570 + lVar6) = &LAB_001118ee;
              boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
            }
            local_b0.start = local_a0;
            local_b0.finish = (char *)0x0;
            local_a0[0] = 0;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(auStack_58 + 2);
            local_c0 = (pointer)((long)&line.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 7);
            iVar13 = __s[local_cc];
            iVar15 = -iVar13;
            if (0 < iVar13) {
              iVar15 = iVar13;
            }
            local_c8 = (pointer)CONCAT44(local_c8._4_4_,iVar15);
            local_b8 = '0';
            local_b4 = 0x30;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fd3f;
            pbVar26 = (pointer)boost::detail::
                               lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::
                               convert((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>
                                        *)&local_c8);
            pcVar16 = local_b0.finish;
            if (iVar13 < 0) {
              pbVar26[-1].field_2._M_local_buf[0xf] = '-';
              pbVar26 = (pointer)((long)&pbVar26[-1].field_2._M_allocated_capacity + 0xf);
            }
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar26;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fd71;
            std::__cxx11::string::replace((ulong)&local_b0,0,pcVar16,(ulong)pbVar26);
            pcVar16 = local_b0.start;
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fd8b;
            std::__cxx11::string::_M_append(filename.field_2._M_local_buf + 8,(ulong)pcVar16);
            if ((pointer)local_b0.start != (pointer)local_a0) {
              pbVar26 = (pointer)CONCAT71(local_a0._1_7_,local_a0[0]);
              auVar33 = (undefined1  [8])local_b0.start;
LAB_0010fec1:
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fec9;
              operator_delete((void *)auVar33,(ulong)((long)&(pbVar26->_M_dataplus)._M_p + 1));
            }
LAB_0011009b:
            iVar13 = 0;
          }
          else {
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f259;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fbc8;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fbd7;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fbf3;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fc17;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Write: ",7);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fc2f;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                uVar4 = *(undefined8 *)(*(long *)poVar23 + -0x18);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fc46;
                std::ios::widen((char)uVar4 + (char)poVar23);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fc51;
                std::ostream::put((char)poVar23);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fc59;
                std::ostream::flush();
              }
              uVar25 = *(ulong *)(local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fc71;
              std::__cxx11::string::_M_append(filename.field_2._M_local_buf + 8,uVar25);
              goto LAB_0011009b;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f271;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fdcc;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fddb;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fdf7;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fe1b;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Write: M[M[",0xb);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fe33;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fe4a;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]] = ",5);
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fe57;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                iVar13 = __s[__s[iVar13]];
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fe6c;
                poVar23 = (ostream *)std::ostream::operator<<((ostream *)poVar23,iVar13);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fe74;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fe81;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              iVar13 = __s[iVar13];
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fe98;
              boost::lexical_cast<std::__cxx11::string,int>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_58,(boost *)(__s + iVar13),arg);
              auVar33 = auStack_58;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10feac;
              std::__cxx11::string::_M_append(filename.field_2._M_local_buf + 8,(ulong)auVar33);
              pbVar26 = line.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010fec1;
              goto LAB_0011009b;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f289;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10feec;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10fefb;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ff17;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ff3b;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"M[",2);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ff53;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ff6a;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar23,"] --> Working Memory",0x14);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ff72;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ff7f;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ff89;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ffa3;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
LAB_0010ffa9:
                iVar13 = __s[iVar13];
                goto LAB_00110099;
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f2a1;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110002;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110011;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11002d;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110051;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Value: ",7);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110069;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110080;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar23," --> Working Memory",0x13);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110088;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110095;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              goto LAB_00110099;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f2b9;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1100d1;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1100e0;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1100fc;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110120;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"M[M[",4);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110138;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11014f;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar23,"]] --> Working Memory",0x15);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110157;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110164;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11016e;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110188;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                iVar13 = __s[iVar13];
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110199;
                bVar10 = error_registers(iVar13,local_5c);
                if (!bVar10) {
                  pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_a0._24_8_ + 0x20);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1101ae;
                  iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                  iVar13 = __s[iVar13];
                  goto LAB_0010ffa9;
                }
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f2d1;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1101db;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1101ea;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110206;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11022a;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Working Memory --> M[",0x15);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110242;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110259;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]",1);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110261;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11026e;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110278;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                iVar13 = *__s;
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110298;
                iVar15 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
LAB_001103ae:
                __s[iVar15] = iVar13;
                goto LAB_0011009b;
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f2e9;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1102c1;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1102d0;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1102ec;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110310;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Working Memory --> M[M[",0x17);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110328;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11033f;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]]",2);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110347;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110354;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11035e;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110378;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                iVar13 = __s[iVar13];
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110389;
                bVar10 = error_registers(iVar13,local_5c);
                if (!bVar10) {
                  iVar13 = *__s;
                  pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_a0._24_8_ + 0x20);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1103a4;
                  iVar15 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                  iVar15 = __s[iVar15];
                  goto LAB_001103ae;
                }
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f301;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1103d4;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1103e3;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1103ff;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110423;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] + M[",9);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11043b;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110452;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"] --> M[0]",10);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11045a;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110467;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110471;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                iVar15 = *__s;
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110491;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
LAB_00110497:
                iVar15 = iVar15 + __s[iVar13];
LAB_0011049a:
                *__s = iVar15;
                goto LAB_0011009b;
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f319;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1104bf;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1104ce;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1104ea;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11050e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] + ",7);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110526;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11053d;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23," --> M[0]",9);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110545;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              iVar15 = *__s;
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110558;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              iVar13 = iVar13 + iVar15;
              goto LAB_00110099;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f331;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11057d;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11058c;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1105a8;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1105cc;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] + M[M[",0xb);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1105e4;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1105fb;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]] --> M[0]",0xb);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110603;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110610;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11061a;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110634;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                iVar13 = __s[iVar13];
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110645;
                bVar10 = error_registers(iVar13,local_5c);
                if (!bVar10) {
                  iVar15 = *__s;
                  pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_a0._24_8_ + 0x20);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110660;
                  iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                  iVar13 = __s[iVar13];
                  goto LAB_00110497;
                }
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f349;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11068d;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11069d;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1106b9;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1106dd;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] - M[",9);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1106f5;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11070c;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"] --> M[0]",10);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110714;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110721;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11072b;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                iVar15 = *__s;
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11074b;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
LAB_00110751:
                iVar15 = iVar15 - __s[iVar13];
                goto LAB_0011049a;
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f361;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110778;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110788;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1107a4;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1107c8;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] - ",7);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1107e0;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1107f7;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23," --> M[0]",9);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1107ff;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              iVar13 = *__s;
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110812;
              iVar15 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *__s = iVar13 - iVar15;
              goto LAB_0011009b;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f379;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11083e;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11084e;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11086a;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11088e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] - M[M[",0xb);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1108a6;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1108bd;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]] --> M[0]",0xb);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1108c5;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1108d2;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1108dc;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1108f6;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                iVar13 = __s[iVar13];
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110907;
                bVar10 = error_registers(iVar13,local_5c);
                if (!bVar10) {
                  iVar15 = *__s;
                  pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_a0._24_8_ + 0x20);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110922;
                  iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                  iVar13 = __s[iVar13];
                  goto LAB_00110751;
                }
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f391;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110950;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110960;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11097c;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1109a0;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] * M[",9);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1109b8;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1109cf;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"] --> M[0]",10);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1109d7;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1109e4;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1109ee;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                iVar15 = *__s;
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110a0e;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
LAB_00110a14:
                iVar15 = iVar15 * __s[iVar13];
                goto LAB_0011049a;
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f3a9;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110a3c;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110a4c;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110a68;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110a8c;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] * ",7);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110aa4;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110abb;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23," --> M[0]",9);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110ac3;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              iVar15 = *__s;
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110ad6;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              iVar13 = iVar13 * iVar15;
LAB_00110099:
              *__s = iVar13;
              goto LAB_0011009b;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f3c1;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110afd;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110b0d;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110b29;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110b4d;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] * M[M[",0xb);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110b65;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110b7c;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]] --> M[0]",0xb);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110b84;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110b91;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110b9b;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110bb5;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                iVar13 = __s[iVar13];
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110bc6;
                bVar10 = error_registers(iVar13,local_5c);
                if (!bVar10) {
                  iVar15 = *__s;
                  pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_a0._24_8_ + 0x20);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110be1;
                  iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                  iVar13 = __s[iVar13];
                  goto LAB_00110a14;
                }
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f3d9;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110c0f;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110c1f;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110c3b;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110c5f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] / M[",9);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110c77;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110c8e;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"] --> M[0]",10);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110c96;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110ca3;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110cad;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                iVar13 = *__s;
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110ccd;
                iVar15 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
LAB_00110cd7:
                *__s = iVar13 / __s[iVar15];
                goto LAB_0011009b;
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f3f1;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110d00;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110d10;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110d2c;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110d50;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] / ",7);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110d68;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110d7f;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23," --> M[0]",9);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110d87;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              iVar13 = *__s;
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110d9a;
              iVar15 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              iVar13 = iVar13 / iVar15;
              goto LAB_00110099;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f409;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110eb0;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110ec0;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110edc;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f00;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"M[0] / M[M[",0xb);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f18;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f2f;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]] --> M[0]",0xb);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f37;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f44;
              iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f4e;
              bVar10 = error_registers(iVar13,local_5c);
              if (!bVar10) {
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f68;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                iVar13 = __s[iVar13];
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f79;
                bVar10 = error_registers(iVar13,local_5c);
                if (!bVar10) {
                  iVar13 = *__s;
                  pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_a0._24_8_ + 0x20);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110f94;
                  iVar15 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                  iVar15 = __s[iVar15];
                  goto LAB_00110cd7;
                }
              }
              goto LAB_0010fb4a;
            }
            *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f421;
            iVar13 = std::__cxx11::string::compare((char *)uVar4);
            uVar4 = local_a0._24_8_;
            if (iVar13 == 0) {
LAB_00110da6:
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110dc5;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110dd5;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110df1;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node != &local_180) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110e15;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Jump to LABEL \'",0xf);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110e2d;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110e44;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\'",1);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110e4c;
                std::endl<char,std::char_traits<char>>(poVar23);
              }
              pkVar30 = (key_type *)(local_a0._24_8_ + 0x20);
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110e60;
              pmVar24 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)((long)&fetch.field_2 + 8),pkVar30);
              if (*pmVar24 == 0) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110fbe;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"<!> Label \'",0xb);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110fd6;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110fed;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\' not found.",0xc);
LAB_0010ffcc:
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10ffd9;
                std::endl<char,std::char_traits<char>>(poVar23);
                iVar11 = 1;
                iVar13 = 1;
              }
              else {
LAB_00110e69:
                pkVar30 = (key_type *)(local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110e7d;
                p_Var27 = (_Ios_Seekdir *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        *)((long)&fetch.field_2 + 8),pkVar30);
                _Var3 = *p_Var27;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x110e8c;
                std::istream::seekg((long)local_4b0,_Var3);
                iVar13 = 0;
              }
            }
            else {
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f439;
              iVar13 = std::__cxx11::string::compare((char *)uVar4);
              uVar4 = local_a0._24_8_;
              if (iVar13 == 0) goto LAB_00110da6;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f451;
              iVar13 = std::__cxx11::string::compare((char *)uVar4);
              uVar4 = local_a0._24_8_;
              if (iVar13 == 0) {
                if (*__s != 0) {
                  auStack_58 = (undefined1  [8])
                               &line.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11101e;
                  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","")
                  ;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11102e;
                  cVar19 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                           ::find(local_188,(key_type *)auStack_58);
                  auVar33 = auStack_58;
                  if (auStack_58 !=
                      (undefined1  [8])
                      &line.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
                    p_Var7 = &(line.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                    *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11104a;
                    operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
                  }
                  lVar28 = 0x16;
                  pcVar16 = "Can\'t jump: M[0] != 0 ";
LAB_001114bf:
                  if (cVar19._M_node == &local_180) goto LAB_0011009b;
                  poVar23 = (ostream *)&std::cout;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1114de;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar16,lVar28);
LAB_001114de:
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1114e6;
                  std::endl<char,std::char_traits<char>>(poVar23);
                  goto LAB_0011009b;
                }
                auStack_58 = (undefined1  [8])
                             &line.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11123d;
                std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11124d;
                cVar19 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         ::find(local_188,(key_type *)auStack_58);
                auVar33 = auStack_58;
                if (auStack_58 !=
                    (undefined1  [8])
                    &line.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
                  p_Var7 = &(line.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111269;
                  operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
                }
                if (cVar19._M_node != &local_180) {
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11128d;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Jump to LABEL \'",0xf);
                  pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                  lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1112a5;
                  poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,pcVar16,lVar28);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1112bc;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\'",1);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1112c4;
                  std::endl<char,std::char_traits<char>>(poVar23);
                }
                pkVar30 = (key_type *)(local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1112d8;
                pmVar24 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        *)((long)&fetch.field_2 + 8),pkVar30);
                if (*pmVar24 == 0) {
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1112f9;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"<!> Label \'",0xb);
                  pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                  lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111311;
                  poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,pcVar16,lVar28);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111328;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\' not found.",0xc);
                  goto LAB_0010ffcc;
                }
                goto LAB_00110e69;
              }
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f469;
              iVar13 = std::__cxx11::string::compare((char *)uVar4);
              uVar4 = local_a0._24_8_;
              if (iVar13 == 0) {
                if (*__s < 1) {
                  auStack_58 = (undefined1  [8])
                               &line.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111487;
                  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","")
                  ;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111497;
                  cVar19 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                           ::find(local_188,(key_type *)auStack_58);
                  auVar33 = auStack_58;
                  if (auStack_58 !=
                      (undefined1  [8])
                      &line.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
                    p_Var7 = &(line.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                    *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1114b3;
                    operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
                  }
                  lVar28 = 0x15;
                  pcVar16 = "Can\'t jump: M[0] < 0 ";
                  goto LAB_001114bf;
                }
                auStack_58 = (undefined1  [8])
                             &line.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111087;
                std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111097;
                cVar19 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         ::find(local_188,(key_type *)auStack_58);
                auVar33 = auStack_58;
                if (auStack_58 !=
                    (undefined1  [8])
                    &line.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
                  p_Var7 = &(line.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1110b3;
                  operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
                }
                if (cVar19._M_node != &local_180) {
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1110d7;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Jump to LABEL \'",0xf);
                  pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                  lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1110ef;
                  poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,pcVar16,lVar28);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111106;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\'",1);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11110e;
                  std::endl<char,std::char_traits<char>>(poVar23);
                }
                pkVar30 = (key_type *)(local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111122;
                pmVar24 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        *)((long)&fetch.field_2 + 8),pkVar30);
                if (*pmVar24 != 0) goto LAB_00110e69;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111143;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"<!> Label \'",0xb);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11115b;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111172;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\' not found.",0xc);
                goto LAB_0010ffcc;
              }
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f481;
              iVar13 = std::__cxx11::string::compare((char *)uVar4);
              uVar4 = local_a0._24_8_;
              if (iVar13 == 0) {
                auStack_58 = (undefined1  [8])
                             &line.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111196;
                std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1111a6;
                cVar19 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         ::find(local_188,(key_type *)auStack_58);
                auVar33 = auStack_58;
                if (auStack_58 !=
                    (undefined1  [8])
                    &line.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
                  p_Var7 = &(line.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1111c2;
                  operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
                }
                if (cVar19._M_node == &local_180) goto LAB_0011009b;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1111ea;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Found LABEL \'",0xd);
                pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111202;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar16,lVar28);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111219;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\'",1);
                goto LAB_001114de;
              }
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f499;
              iVar13 = std::__cxx11::string::compare((char *)uVar4);
              if (iVar13 != 0) {
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f4b9;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"<!> Syntax error \'",0x12);
                _Var8 = fetch._M_dataplus;
                auVar33 = local_1e8;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f4d3;
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)auVar33,(long)_Var8._M_p);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x10f4ea;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\'",1);
                goto LAB_0010ffcc;
              }
              auStack_58 = (undefined1  [8])
                           &line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11134c;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11135c;
              cVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_188,(key_type *)auStack_58);
              auVar33 = auStack_58;
              if (auStack_58 !=
                  (undefined1  [8])
                  &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                p_Var7 = &(line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111378;
                operator_delete((void *)auVar33,(ulong)((long)&p_Var7->_M_p + 1));
              }
              if (cVar19._M_node == &local_180) {
                iVar13 = 5;
              }
              else {
                pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a0._24_8_ + 0x20);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111395;
                iVar13 = boost::lexical_cast<int,std::__cxx11::string>(pbVar34);
                if (iVar13 != 1) {
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11150d;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"<!> Invalid debug option \'",0x1a);
                  pcVar16 = *(char **)(local_a0._24_8_ + 0x20);
                  lVar28 = *(long *)(local_a0._24_8_ + 0x28);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111525;
                  poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,pcVar16,lVar28);
                  *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11153c;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\'",1);
                  goto LAB_0010ffcc;
                }
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1113b6;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Registers dump: ",0x10);
                *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1113c2;
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                iVar13 = 0;
                if (0 < (int)local_5c) {
                  local_d8 = 0;
                  do {
                    *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1113f1;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"         M[",0xb);
                    *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111404;
                    poVar23 = (ostream *)
                              std::ostream::operator<<((ostream *)&std::cout,(int)local_d8);
                    outtape.field_2._8_8_ = poVar23;
                    *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111423;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar23,"] = ",4);
                    uVar4 = outtape.field_2._8_8_;
                    iVar13 = __s[local_d8];
                    *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11143d;
                    poVar23 = (ostream *)std::ostream::operator<<((ostream *)uVar4,iVar13);
                    *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111445;
                    std::endl<char,std::char_traits<char>>(poVar23);
                    local_d8 = local_d8 + 1;
                    iVar13 = 0;
                  } while (local_258 != local_d8);
                }
              }
            }
          }
        }
LAB_0011009d:
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1100a6;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_a0 + 0x18));
      } while (iVar13 == 0);
      if (iVar13 == 5) {
LAB_001115ee:
        iVar11 = 0;
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x1115fd;
        std::ifstream::close();
      }
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111609;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)((long)&fetch.field_2 + 8));
      auVar33 = local_1e8;
      if (local_1e8 != (undefined1  [8])&fetch._M_string_length) {
        lVar28 = CONCAT71(fetch._M_string_length._1_7_,(undefined1)fetch._M_string_length);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11162b;
        operator_delete((void *)auVar33,lVar28 + 1);
      }
      *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111637;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_f8);
      uVar4 = filename.field_2._8_8_;
      if ((size_type *)filename.field_2._8_8_ != &outtape._M_string_length) {
        lVar28 = CONCAT71(outtape._M_string_length._1_7_,(undefined1)outtape._M_string_length);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x111659;
        operator_delete((void *)uVar4,lVar28 + 1);
      }
      auVar33 = local_250;
      pplVar29 = (long **)local_260;
      if (local_250 != (undefined1  [8])&intapetmp._M_string_length) {
        lVar28 = CONCAT71(intapetmp._M_string_length._1_7_,(undefined1)intapetmp._M_string_length);
        *(undefined8 *)((long)&uStack_570 + lVar6) = 0x11167b;
        operator_delete((void *)auVar33,lVar28 + 1);
        pplVar29 = (long **)local_260;
      }
    }
    *(undefined8 *)((long)pplVar29 + -8) = 0x11168e;
    std::ifstream::~ifstream(local_4b0);
    uVar4 = intapetmp.field_2._8_8_;
    if ((size_type *)intapetmp.field_2._8_8_ != &filename._M_string_length) {
      *(undefined8 *)((long)pplVar29 + -8) = 0x1116b0;
      operator_delete((void *)uVar4,filename._M_string_length + 1);
    }
  }
  else {
    uStack_570 = 0x10ea3b;
    plVar20 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)&local_568);
    uStack_570 = 0x10ea52;
    std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
    uStack_570 = 0x10ea5d;
    std::ostream::put((char)plVar20);
    iVar11 = 1;
    uStack_570 = 0x10ea6b;
    std::ostream::flush();
  }
  know_label._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)std::ios::clear;
  *(undefined8 *)((long)pplVar29 + -8) = 0x1116cb;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_128);
  *(undefined8 *)((long)pplVar29 + -8) = 0x1116d7;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_158);
  *(undefined8 *)((long)pplVar29 + -8) = 0x1116e3;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_188);
  if (local_4d0 != local_4c0) {
    *(undefined8 *)((long)pplVar29 + -8) = 0x111702;
    operator_delete(local_4d0,local_4c0[0] + 1);
  }
  *(undefined8 *)((long)pplVar29 + -8) = 0x11170e;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e8);
  *(undefined8 *)((long)pplVar29 + -8) = 0x11171d;
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_500);
  if (local_528 != (void *)0x0) {
    *(undefined8 *)((long)pplVar29 + -8) = 0x111735;
    operator_delete(local_528,local_508 - (long)local_528);
    local_528 = (void *)0x0;
    local_520 = 0;
    local_518 = 0;
    local_510 = 0;
    local_508 = 0;
  }
  *(undefined8 *)((long)pplVar29 + -8) = 0x111767;
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_540);
  if (local_568 != local_558) {
    *(undefined8 *)((long)pplVar29 + -8) = 0x111786;
    operator_delete(local_568,local_558[0] + 1);
  }
  return iVar11;
}

Assistant:

int main(int argc, char **argv) {
    options_description desc("SimRam - RAM Emulator");
    desc.add_options()
    ("help,h", "prints this")
    ("verbose,v", "enable verbose mode")
    ("registers,r", value<int>(), "set max number of virtual registers")
    ("input,i", value<string>(), "input file")
    ;

    positional_options_description p;
    p.add("input", -1);

    variables_map vm;
    store(command_line_parser(argc, argv).
          options(desc).positional(p).run(), vm);

    notify(vm);

    if(vm.count("help"))
    {
        cout << desc << endl;
        return 1;
    }
    
    int regnumber;
    
    if(vm.count("reg"))
    {
        regnumber = vm["reg"].as<int>();
        if(vm.count("verbose")) cout << "The number of virtual registers was set to " << regnumber << endl;
    } else
    {
        regnumber = REGNUMBER;
    }

    string filename = "input.ram";

    if(vm.count("input"))
    {
        filename = vm["input"].as<string>();
        if(vm.count("verbose")) cout << "The source code was set to '" << filename << "'" << endl;
    }

    ifstream source_file (filename.c_str());

    if (!source_file.is_open())
    {
        cout << "<!> Unable to open file" << endl;
        return EXIT_FAILURE;
    }

    int registers[regnumber];

    memset(registers,0,sizeof(int)*regnumber);

    int inpointer = 0;

    string intapetmp;
    string outtape;
    vector<string> intape;
    
    cout << "Insert input tape (use comma for insert new value): ";
    cin >> intapetmp;
    
    boost::algorithm::split(intape, intapetmp, boost::algorithm::is_any_of(","));
    
    if(vm.count("verbose")) cout<<"There are " << intape.size() <<" values in the tape." << endl;

    string fetch;

    // TODO search LABEL.

    map<string, int> know_label;

    while(!source_file.eof())
    {
        getline(source_file, fetch);

        if(fetch == "halt" || fetch[0] == '#') continue;

        vector<string> line;
        boost::algorithm::split(line, fetch, boost::algorithm::is_any_of(" "));

        if(line[0] == "label") know_label[line[1]] = source_file.tellg();
    }

    source_file.clear();
    source_file.seekg(0, ios::beg);

    while(!source_file.eof())
    {
        // Fetch

        getline(source_file, fetch);

        if(fetch == "halt")
        {
            cout<<"Completed execution with output: "<<outtape<<endl;
            source_file.close();
            return EXIT_SUCCESS;
        } else if(fetch == "" || fetch[0] == '#')
        {
            continue;
        }

        vector<string> line;
        boost::algorithm::split(line, fetch, boost::algorithm::is_any_of(" "));

        // Decode / Execute

        // TODO remove pointer overflow on registers
	// TODO usa una hashmap con comando --> puntatore funzione per migliorare esecuzione.

        if(line[0] == "read")
        {
            if(vm.count("verbose")) cout<<"Read: "<<intape[inpointer]<<" --> M["<<line[1]<<"]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(inpointer >= intape.size())
            {
                cerr << "<!> The input tape is finished." << endl;
                return EXIT_FAILURE;
            }
            registers[boost::lexical_cast<int>(line[1])] = boost::lexical_cast<int>(intape[inpointer]);
            inpointer++;

        } else if(line[0] == "read*")
        {
            if(vm.count("verbose")) cout<<"Read: "<<intape[inpointer]<<" --> M[M["<<line[1]<<"]]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            if(inpointer >= intape.size())
            {
                cerr<<"<!> The input tape is finished."<<endl;
                return EXIT_FAILURE;
            }
            registers[registers[boost::lexical_cast<int>(line[1])]] = boost::lexical_cast<int>(intape[inpointer]);
            inpointer++;

        } else if(line[0] == "write")
        {
            if(vm.count("verbose")) cout<<"Write: M["<<line[1]<<"] = "<<registers[boost::lexical_cast<int>(line[1])]<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            outtape += boost::lexical_cast<string>(registers[boost::lexical_cast<int>(line[1])]);

        } else if(line[0] == "write=")
        {
            if(vm.count("verbose")) cout<<"Write: "<<line[1]<<endl;
            outtape += line[1];

        } else if(line[0] == "write*")
        {
            if(vm.count("verbose")) cout<<"Write: M[M["<<line[1]<<"]] = "<<registers[registers[boost::lexical_cast<int>(line[1])]]<<endl;
            outtape += boost::lexical_cast<string>(registers[registers[boost::lexical_cast<int>(line[1])]]);

        } else if(line[0] == "load")
        {
            if(vm.count("verbose")) cout<<"M["<<line[1]<<"] --> Working Memory"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "load=")
        {
            if(vm.count("verbose")) cout<<"Value: "<<line[1]<<" --> Working Memory"<<endl;
            registers[0] = boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "load*")
        {
            if(vm.count("verbose")) cout<<"M[M["<<line[1]<<"]] --> Working Memory"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "store")
        {
            if(vm.count("verbose")) cout<<"Working Memory --> M["<<line[1]<<"]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[boost::lexical_cast<int>(line[1])] = registers[0];

        } else if(line[0] == "store*")
        {
            if(vm.count("verbose")) cout<<"Working Memory --> M[M["<<line[1]<<"]]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[registers[boost::lexical_cast<int>(line[1])]] = registers[0];

        } else if(line[0] == "add")
        {
            if(vm.count("verbose")) cout<<"M[0] + M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] + registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "add=")
        {
            if(vm.count("verbose")) cout<<"M[0] + "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] + boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "add*")
        {
            if(vm.count("verbose")) cout<<"M[0] + M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] + registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "sub")
        {
            if(vm.count("verbose")) cout<<"M[0] - M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] - registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "sub=")
        {
            if(vm.count("verbose")) cout<<"M[0] - "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] - boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "sub*")
        {
            if(vm.count("verbose")) cout<<"M[0] - M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] - registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "mul")
        {
            if(vm.count("verbose")) cout<<"M[0] * M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] * registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "mul=")
        {
            if(vm.count("verbose")) cout<<"M[0] * "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] * boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "mul*")
        {
            if(vm.count("verbose")) cout<<"M[0] * M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] * registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "div")
        {
            if(vm.count("verbose")) cout<<"M[0] / M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] / registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "div=")
        {
            if(vm.count("verbose")) cout<<"M[0] / "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] / boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "div*")
        {
            if(vm.count("verbose")) cout<<"M[0] / M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] / registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "jmp" || line[0] == "jump")
        {
            if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
            if(know_label[line[1]] == NULL)
            {
                cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                return EXIT_FAILURE;
            }
            source_file.seekg(know_label[line[1]], ios::beg);

        } else if(line[0] == "jz")
        {
            if(registers[0] == 0)
            {
                if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
                if(know_label[line[1]] == NULL)
                {
                    cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                    return EXIT_FAILURE;
                }
                source_file.seekg(know_label[line[1]], ios::beg);
            }
            else
            {
                if(vm.count("verbose")) cout<<"Can't jump: M[0] != 0 "<<endl;
            }

        } else if(line[0] == "jgz")
        {
            if(registers[0] > 0)
            {
                if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
                if(know_label[line[1]] == NULL)
                {
                    cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                    return EXIT_FAILURE;
                }
                source_file.seekg(know_label[line[1]], ios::beg);
            }
            else
            {
                if(vm.count("verbose")) cout<<"Can't jump: M[0] < 0 "<<endl;
            }

        } else if(line[0] == "label")
        {
            if(vm.count("verbose")) cout<<"Found LABEL '"<<line[1]<<"'"<<endl;

        } else if(line[0] == "debug")
        {
            if(!vm.count("verbose")) break;
            switch(boost::lexical_cast<int>(line[1]))
            {
            case 1:
                cout<<"Registers dump: "<<endl;
                for(int i = 0; i < regnumber; i++)
                {
                    cout<<"         M["<<i<<"] = "<<registers[i]<<endl;
                }
                break;
            default:
                cerr<<"<!> Invalid debug option '"<<line[1]<<"'"<<endl;
                return EXIT_FAILURE;
            }

        } else
        {
            cerr<<"<!> Syntax error '"<<fetch<<"'"<<endl;
            return EXIT_FAILURE;
        }

    }

    source_file.close();

    return EXIT_SUCCESS;
}